

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O3

void __thiscall
soul::heart::IODeclaration::checkDataTypesValid<soul::CodeLocation&>
          (IODeclaration *this,CodeLocation *errorLocation)

{
  undefined1 uVar1;
  Primitive PVar2;
  pointer pTVar3;
  Structure *o;
  pointer pTVar4;
  bool bVar5;
  pointer pTVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe68;
  string local_188;
  string local_168;
  CompileMessage local_148;
  CompileMessage local_110;
  CompileMessage local_d8;
  CompileMessage local_a0;
  CompileMessage local_68;
  
  if (this->endpointType == stream) {
    pTVar3 = (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((long)(this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
              super__Vector_impl_data._M_finish - (long)pTVar3 != 0x18) {
      CompileMessageHelpers::createMessage<>
                (&local_68,syntax,error,"Multiple data types not supported by this endpoint type");
      CodeLocation::throwError(errorLocation,&local_68);
    }
    uVar1 = pTVar3->category;
    PVar2 = (pTVar3->primitiveType).type;
    o = (pTVar3->structure).object;
    if (o != (Structure *)0x0) {
      (o->super_RefCountedObject).refCount = (o->super_RefCountedObject).refCount + 1;
    }
    if (1 < (byte)(uVar1 - 1)) {
      CompileMessageHelpers::createMessage<>
                (&local_d8,syntax,error,"Only primitives or vectors supported by this endpoint type"
                );
      CodeLocation::throwError(errorLocation,&local_d8);
    }
    if (PVar2 == void_) {
      CompileMessageHelpers::createMessage<>
                (&local_110,syntax,error,"void is not a valid endpoint type");
      CodeLocation::throwError(errorLocation,&local_110);
    }
    RefCountedPtr<soul::Structure>::decIfNotNull(o);
  }
  pTVar4 = (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pTVar3 = (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
           super__Vector_impl_data._M_start;
  for (pTVar6 = pTVar3; pTVar6 != pTVar4; pTVar6 = pTVar6 + 1) {
    if ((pTVar6->primitiveType).type == void_) {
      CompileMessageHelpers::createMessage<>
                (&local_a0,syntax,error,"void is not a valid endpoint type");
      CodeLocation::throwError(errorLocation,&local_a0);
    }
  }
  if (1 < (ulong)(((long)pTVar4 - (long)pTVar3 >> 3) * -0x5555555555555555)) {
    uVar7 = 1;
    do {
      lVar9 = 0;
      uVar8 = uVar7;
      do {
        pTVar3 = (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        bVar5 = Type::isEqual(pTVar3 + uVar7,(Type *)(&pTVar3->category + lVar9),4);
        if (bVar5) {
          Type::getDescription_abi_cxx11_
                    (&local_168,
                     (Type *)(&((this->dataTypes).
                                super__Vector_base<soul::Type,_std::allocator<soul::Type>_>._M_impl.
                                super__Vector_impl_data._M_start)->category + lVar9));
          Type::getDescription_abi_cxx11_
                    (&local_188,
                     (this->dataTypes).super__Vector_base<soul::Type,_std::allocator<soul::Type>_>.
                     _M_impl.super__Vector_impl_data._M_start + uVar7);
          CompileMessageHelpers::createMessage<std::__cxx11::string,std::__cxx11::string>
                    (&local_148,(CompileMessageHelpers *)0x1,none,0x27d617,(char *)&local_168,
                     &local_188,in_stack_fffffffffffffe68);
          CodeLocation::throwError(errorLocation,&local_148);
        }
        lVar9 = lVar9 + 0x18;
        uVar8 = uVar8 - 1;
      } while (uVar8 != 0);
      uVar7 = uVar7 + 1;
    } while (uVar7 < (ulong)(((long)(this->dataTypes).
                                    super__Vector_base<soul::Type,_std::allocator<soul::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_finish -
                              (long)(this->dataTypes).
                                    super__Vector_base<soul::Type,_std::allocator<soul::Type>_>.
                                    _M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  return;
}

Assistant:

void checkDataTypesValid (Thrower&& errorLocation)
        {
            if (isStreamEndpoint())
            {
                if (dataTypes.size() != 1)
                    errorLocation.throwError (Errors::noMultipleTypesOnEndpoint());

                auto dataType = dataTypes.front();

                if (! dataType.isPrimitiveOrVector())
                    errorLocation.throwError (Errors::illegalTypeForEndpoint());

                if (dataType.isVoid())
                    errorLocation.throwError (Errors::voidCannotBeUsedForEndpoint());
            }

            for (auto& dataType : dataTypes)
                if (dataType.isVoid())
                    errorLocation.throwError (Errors::voidCannotBeUsedForEndpoint());

            for (size_t i = 1; i < dataTypes.size(); ++i)
                for (size_t j = 0; j < i; ++j)
                    if (dataTypes[i].isEqual (dataTypes[j], Type::ignoreVectorSize1))
                        errorLocation.throwError (Errors::duplicateTypesInList (dataTypes[j].getDescription(),
                                                                                dataTypes[i].getDescription()));
        }